

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt_wallet_tests.cpp
# Opt level: O0

void __thiscall wallet::psbt_wallet_tests::parse_hd_keypath::test_method(parse_hd_keypath *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdbc8;
  undefined7 in_stack_ffffffffffffdbd0;
  undefined1 in_stack_ffffffffffffdbd7;
  undefined7 in_stack_ffffffffffffdbd8;
  undefined1 in_stack_ffffffffffffdbdf;
  const_string *in_stack_ffffffffffffdbf0;
  size_t in_stack_ffffffffffffdbf8;
  size_t line_num;
  undefined7 in_stack_ffffffffffffdc00;
  undefined1 in_stack_ffffffffffffdc07;
  lazy_ostream *in_stack_ffffffffffffdc08;
  undefined7 in_stack_ffffffffffffdc10;
  undefined1 in_stack_ffffffffffffdc17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined7 in_stack_ffffffffffffdc28;
  undefined1 in_stack_ffffffffffffdc2f;
  string *in_stack_ffffffffffffdc30;
  parse_hd_keypath *this_local;
  const_string local_1ce0 [2];
  lazy_ostream local_1cc0 [2];
  undefined1 local_1c99 [57];
  const_string local_1c60 [2];
  lazy_ostream local_1c40 [2];
  undefined1 local_1c19 [57];
  const_string local_1be0 [2];
  lazy_ostream local_1bc0 [2];
  allocator<char> local_1b99;
  assertion_result local_1b98 [2];
  const_string local_1b60 [2];
  lazy_ostream local_1b40 [2];
  allocator<char> local_1b19;
  assertion_result local_1b18 [2];
  const_string local_1ae0 [2];
  lazy_ostream local_1ac0 [2];
  allocator<char> local_1a99;
  assertion_result local_1a98 [2];
  const_string local_1a60 [2];
  lazy_ostream local_1a40 [2];
  allocator<char> local_1a19;
  assertion_result local_1a18 [2];
  const_string local_19e0 [2];
  lazy_ostream local_19c0 [2];
  allocator<char> local_1999;
  assertion_result local_1998 [2];
  const_string local_1960 [2];
  lazy_ostream local_1940 [2];
  allocator<char> local_1919;
  assertion_result local_1918 [2];
  const_string local_18e0 [2];
  lazy_ostream local_18c0 [2];
  allocator<char> local_1899;
  assertion_result local_1898 [2];
  const_string local_1860 [2];
  lazy_ostream local_1840 [2];
  allocator<char> local_1819;
  assertion_result local_1818 [2];
  const_string local_17e0 [2];
  lazy_ostream local_17c0 [2];
  allocator<char> local_1799;
  assertion_result local_1798 [2];
  const_string local_1760 [2];
  lazy_ostream local_1740 [2];
  allocator<char> local_1719;
  assertion_result local_1718 [2];
  const_string local_16e0 [2];
  lazy_ostream local_16c0 [2];
  allocator<char> local_1699;
  assertion_result local_1698 [2];
  const_string local_1660 [2];
  lazy_ostream local_1640 [2];
  allocator<char> local_1619;
  assertion_result local_1618 [2];
  const_string local_15e0 [2];
  lazy_ostream local_15c0 [2];
  allocator<char> local_1599;
  assertion_result local_1598 [2];
  const_string local_1560 [2];
  lazy_ostream local_1540 [2];
  allocator<char> local_1519;
  assertion_result local_1518 [2];
  const_string local_14e0 [2];
  lazy_ostream local_14c0 [2];
  allocator<char> local_1499;
  assertion_result local_1498 [2];
  const_string local_1460 [2];
  lazy_ostream local_1440 [2];
  allocator<char> local_1419;
  assertion_result local_1418 [2];
  const_string local_13e0 [2];
  lazy_ostream local_13c0 [2];
  allocator<char> local_1399;
  assertion_result local_1398 [2];
  const_string local_1360 [2];
  lazy_ostream local_1340 [2];
  allocator<char> local_1319;
  assertion_result local_1318 [2];
  const_string local_12e0 [2];
  lazy_ostream local_12c0 [2];
  allocator<char> local_1299;
  assertion_result local_1298 [2];
  const_string local_1260 [2];
  lazy_ostream local_1240 [2];
  allocator<char> local_1219;
  assertion_result local_1218 [2];
  const_string local_11e0 [2];
  lazy_ostream local_11c0 [2];
  allocator<char> local_1199;
  assertion_result local_1198 [2];
  const_string local_1160 [2];
  lazy_ostream local_1140 [2];
  allocator<char> local_1119;
  assertion_result local_1118 [2];
  const_string local_10e0 [2];
  lazy_ostream local_10c0 [2];
  allocator<char> local_1099;
  assertion_result local_1098 [2];
  const_string local_1060 [2];
  lazy_ostream local_1040 [2];
  allocator<char> local_1019;
  assertion_result local_1018;
  undefined8 local_1000;
  const_string local_fe0 [2];
  lazy_ostream local_fc0 [2];
  allocator<char> local_f99;
  assertion_result local_f98 [2];
  const_string local_f60 [2];
  lazy_ostream local_f40 [2];
  allocator<char> local_f19;
  assertion_result local_f18 [2];
  const_string local_ee0 [2];
  lazy_ostream local_ec0 [2];
  allocator<char> local_e99;
  assertion_result local_e98 [2];
  const_string local_e60 [2];
  lazy_ostream local_e40 [2];
  allocator<char> local_e19;
  assertion_result local_e18 [2];
  const_string local_de0 [2];
  lazy_ostream local_dc0 [2];
  allocator<char> local_d99;
  assertion_result local_d98 [2];
  const_string local_d60 [2];
  lazy_ostream local_d40 [2];
  allocator<char> local_d19;
  assertion_result local_d18 [2];
  const_string local_ce0 [2];
  lazy_ostream local_cc0 [2];
  allocator<char> local_c99;
  assertion_result local_c98 [2];
  const_string local_c60 [2];
  lazy_ostream local_c40 [2];
  allocator<char> local_c19;
  assertion_result local_c18 [2];
  const_string local_be0 [2];
  lazy_ostream local_bc0 [2];
  allocator<char> local_b99;
  assertion_result local_b98 [2];
  const_string local_b60 [2];
  lazy_ostream local_b40 [2];
  allocator<char> local_b19;
  assertion_result local_b18 [2];
  const_string local_ae0 [2];
  lazy_ostream local_ac0 [2];
  allocator<char> local_a99;
  assertion_result local_a98 [2];
  const_string local_a60 [2];
  lazy_ostream local_a40 [2];
  allocator<char> local_a19;
  assertion_result local_a18 [2];
  const_string local_9e0 [2];
  lazy_ostream local_9c0 [2];
  allocator<char> local_999;
  assertion_result local_998 [2];
  const_string local_960 [2];
  lazy_ostream local_940 [2];
  allocator<char> local_919;
  assertion_result local_918 [2];
  const_string local_8e0 [2];
  lazy_ostream local_8c0 [2];
  allocator<char> local_899;
  assertion_result local_898 [2];
  const_string local_860 [2];
  lazy_ostream local_840 [2];
  allocator<char> local_819;
  assertion_result local_818 [2];
  const_string local_7e0 [2];
  lazy_ostream local_7c0 [2];
  allocator<char> local_799;
  assertion_result local_798 [2];
  const_string local_760 [2];
  lazy_ostream local_740 [2];
  allocator<char> local_719;
  assertion_result local_718 [2];
  const_string local_6e0 [2];
  lazy_ostream local_6c0 [2];
  allocator<char> local_699;
  assertion_result local_698 [2];
  const_string local_660 [2];
  lazy_ostream local_640 [2];
  allocator<char> local_619;
  assertion_result local_618 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> keypath;
  
  local_1000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdbc8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_618,local_640,local_660,0x57,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_619);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_698,local_6c0,local_6e0,0x58,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_699);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_718,local_740,local_760,0x5a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_719);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_798,local_7c0,local_7e0,0x5b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_799);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_818,local_840,local_860,0x5d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_819);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_898,local_8c0,local_8e0,0x5e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_899);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_918,local_940,local_960,0x60,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_919);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_998,local_9c0,local_9e0,0x61,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_999);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a18,local_a40,local_a60,99,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_a19);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a98,local_ac0,local_ae0,100,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_a99);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b18,local_b40,local_b60,0x66,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_b19);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b98,local_bc0,local_be0,0x67,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_b99);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c18,local_c40,local_c60,0x69,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_c19);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c98,local_cc0,local_ce0,0x6a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_c99);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d18,local_d40,local_d60,0x6c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_d19);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d98,local_dc0,local_de0,0x6d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_d99);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e18,local_e40,local_e60,0x6f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_e19);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e98,local_ec0,local_ee0,0x70,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_e99);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f18,local_f40,local_f60,0x72,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_f19);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f98,local_fc0,local_fe0,0x73,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_f99);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1018,local_1040,local_1060,0x75,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1019);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1098,local_10c0,local_10e0,0x76,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1099);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1118,local_1140,local_1160,0x78,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1119);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1198,local_11c0,local_11e0,0x79,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1199);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1218,local_1240,local_1260,0x7b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1219);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1298,local_12c0,local_12e0,0x7c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1299);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1318,local_1340,local_1360,0x7e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1319);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1398,local_13c0,local_13e0,0x7f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1399);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1418,local_1440,local_1460,0x81,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1419);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1498,local_14c0,local_14e0,0x82,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1499);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1518,local_1540,local_1560,0x84,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1519);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1598,local_15c0,local_15e0,0x85,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1599);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1618,local_1640,local_1660,0x87,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1619);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1698,local_16c0,local_16e0,0x88,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1699);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1718,local_1740,local_1760,0x8a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1719);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1798,local_17c0,local_17e0,0x8b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1799);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1818,local_1840,local_1860,0x8d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1819);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1898,local_18c0,local_18e0,0x8e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1899);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1918,local_1940,local_1960,0x90,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1919);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1998,local_19c0,local_19e0,0x91,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1999);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1a18,local_1a40,local_1a60,0x93,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1a19);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1a98,local_1ac0,local_1ae0,0x94,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1a99);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1b18,local_1b40,local_1b60,0x96,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1b19);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdc18,
               (char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    in_stack_ffffffffffffdc30 = (string *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1b98,local_1bc0,local_1be0,0x97,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator(&local_1b99);
    in_stack_ffffffffffffdc2f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffdc2f);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c19;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    in_stack_ffffffffffffdc17 =
         ParseHDKeypath(in_stack_ffffffffffffdc30,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    in_stack_ffffffffffffdc08 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_1c19 + 1),local_1c40,local_1c60,0x99,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator((allocator<char> *)local_1c19);
    in_stack_ffffffffffffdc07 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffdc07);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffdc08,
               (const_string *)CONCAT17(in_stack_ffffffffffffdc07,in_stack_ffffffffffffdc00),
               line_num,in_stack_ffffffffffffdbf0);
    in_stack_ffffffffffffdbf0 = (const_string *)local_1c99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_ffffffffffffdc17,in_stack_ffffffffffffdc10),
               (allocator<char> *)in_stack_ffffffffffffdc08);
    ParseHDKeypath(in_stack_ffffffffffffdc30,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT17(in_stack_ffffffffffffdc2f,in_stack_ffffffffffffdc28));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (bool)in_stack_ffffffffffffdbd7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffdbc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8),
               (pointer)CONCAT17(in_stack_ffffffffffffdbd7,in_stack_ffffffffffffdbd0),
               (unsigned_long)in_stack_ffffffffffffdbc8);
    in_stack_ffffffffffffdbc8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)(local_1c99 + 1),local_1cc0,local_1ce0,0x9a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffdbc8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffdbc8);
    std::__cxx11::string::~string(in_stack_ffffffffffffdbc8);
    std::allocator<char>::~allocator((allocator<char> *)local_1c99);
    in_stack_ffffffffffffdbdf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffdbdf);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_ffffffffffffdbdf,in_stack_ffffffffffffdbd8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(parse_hd_keypath)
{
    std::vector<uint32_t> keypath;

    BOOST_CHECK(ParseHDKeypath("1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1", keypath));
    BOOST_CHECK(!ParseHDKeypath("///////////////////////////", keypath));

    BOOST_CHECK(ParseHDKeypath("1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1'/1", keypath));
    BOOST_CHECK(!ParseHDKeypath("//////////////////////////'/", keypath));

    BOOST_CHECK(ParseHDKeypath("1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/", keypath));
    BOOST_CHECK(!ParseHDKeypath("1///////////////////////////", keypath));

    BOOST_CHECK(ParseHDKeypath("1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1'/", keypath));
    BOOST_CHECK(!ParseHDKeypath("1/'//////////////////////////", keypath));

    BOOST_CHECK(ParseHDKeypath("", keypath));
    BOOST_CHECK(!ParseHDKeypath(" ", keypath));

    BOOST_CHECK(ParseHDKeypath("0", keypath));
    BOOST_CHECK(!ParseHDKeypath("O", keypath));

    BOOST_CHECK(ParseHDKeypath("0000'/0000'/0000'", keypath));
    BOOST_CHECK(!ParseHDKeypath("0000,/0000,/0000,", keypath));

    BOOST_CHECK(ParseHDKeypath("01234", keypath));
    BOOST_CHECK(!ParseHDKeypath("0x1234", keypath));

    BOOST_CHECK(ParseHDKeypath("1", keypath));
    BOOST_CHECK(!ParseHDKeypath(" 1", keypath));

    BOOST_CHECK(ParseHDKeypath("42", keypath));
    BOOST_CHECK(!ParseHDKeypath("m42", keypath));

    BOOST_CHECK(ParseHDKeypath("4294967295", keypath)); // 4294967295 == 0xFFFFFFFF (uint32_t max)
    BOOST_CHECK(!ParseHDKeypath("4294967296", keypath)); // 4294967296 == 0xFFFFFFFF (uint32_t max) + 1

    BOOST_CHECK(ParseHDKeypath("m", keypath));
    BOOST_CHECK(!ParseHDKeypath("n", keypath));

    BOOST_CHECK(ParseHDKeypath("m/", keypath));
    BOOST_CHECK(!ParseHDKeypath("n/", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0", keypath));
    BOOST_CHECK(!ParseHDKeypath("n/0", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0'", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/0''", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0'/0'", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/'0/0'", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/0", keypath));
    BOOST_CHECK(!ParseHDKeypath("n/0/0", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/0/00", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/0/0/f00", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/0/000000000000000000000000000000000000000000000000000000000000000000000000000000000000", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/1/1/111111111111111111111111111111111111111111111111111111111111111111111111111111111111", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/00/0", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/0'/00/'0", keypath));

    BOOST_CHECK(ParseHDKeypath("m/1/", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/1//", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/4294967295", keypath)); // 4294967295 == 0xFFFFFFFF (uint32_t max)
    BOOST_CHECK(!ParseHDKeypath("m/0/4294967296", keypath)); // 4294967296 == 0xFFFFFFFF (uint32_t max) + 1

    BOOST_CHECK(ParseHDKeypath("m/4294967295", keypath)); // 4294967295 == 0xFFFFFFFF (uint32_t max)
    BOOST_CHECK(!ParseHDKeypath("m/4294967296", keypath)); // 4294967296 == 0xFFFFFFFF (uint32_t max) + 1
}